

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

void __thiscall glslang::TInputScanner::setFile(TInputScanner *this,char *filename,int i)

{
  int iVar1;
  TString *pTVar2;
  TString *fn_tstr;
  int i_local;
  char *filename_local;
  TInputScanner *this_local;
  
  pTVar2 = NewPoolTString_abi_cxx11_(filename);
  iVar1 = getLastValidSourceIndex(this);
  if (i == iVar1) {
    (this->logicalSourceLoc).name = pTVar2;
  }
  this->loc[i].name = pTVar2;
  return;
}

Assistant:

void setFile(const char* filename, int i)
    {
        TString* fn_tstr = NewPoolTString(filename);
        if (i == getLastValidSourceIndex()) {
            logicalSourceLoc.name = fn_tstr;
        }
        loc[i].name = fn_tstr;
    }